

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerator.cxx
# Opt level: O2

bool cmQtAutoGenerator::FileWrite(string *filename,string *content,string *error)

{
  bool bVar1;
  ofstream ofs;
  
  bVar1 = MakeParentDirectory(filename);
  if (bVar1) {
    std::ofstream::ofstream(&ofs);
    std::ofstream::open((char *)&ofs,(_Ios_Openmode)(filename->_M_dataplus)._M_p);
    if ((((&ofs.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
          [(long)ofs.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3]] & 5
         ) == 0) &&
       (std::operator<<(&ofs.super_basic_ostream<char,_std::char_traits<char>_>,(string *)content),
       *(int *)(&ofs.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20 +
               (long)ofs.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
       == 0)) {
      bVar1 = true;
    }
    else {
      if (error != (string *)0x0) {
        std::__cxx11::string::assign((char *)error);
      }
      bVar1 = false;
    }
    std::ofstream::~ofstream(&ofs);
  }
  else {
    if (error != (string *)0x0) {
      std::__cxx11::string::assign((char *)error);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmQtAutoGenerator::FileWrite(std::string const& filename,
                                  std::string const& content,
                                  std::string* error)
{
  // Make sure the parent directory exists
  if (!cmQtAutoGenerator::MakeParentDirectory(filename)) {
    if (error != nullptr) {
      *error = "Could not create parent directory.";
    }
    return false;
  }
  cmsys::ofstream ofs;
  ofs.open(filename.c_str(),
           (std::ios::out | std::ios::binary | std::ios::trunc));

  // Use lambda to save destructor calls of ofs
  return [&ofs, &content, error]() -> bool {
    if (!ofs) {
      if (error != nullptr) {
        *error = "Opening file for writing failed.";
      }
      return false;
    }
    ofs << content;
    if (!ofs.good()) {
      if (error != nullptr) {
        *error = "File writing failed.";
      }
      return false;
    }
    return true;
  }();
}